

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.cpp
# Opt level: O3

void __thiscall embree::Points::Points(Points *this,Device *device,GType gtype)

{
  size_t *psVar1;
  bool *pbVar2;
  undefined8 *puVar3;
  undefined4 *puVar4;
  Device *pDVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  long *plVar7;
  BufferView<embree::Vec3fa> *pBVar8;
  BufferView<embree::Vec3fa> *pBVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  Buffer *pBVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int iVar20;
  undefined4 extraout_var;
  undefined8 *puVar21;
  long lVar22;
  undefined4 extraout_var_00;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  
  Geometry::Geometry(&this->super_Geometry,device,gtype,0,1);
  (this->super_Geometry).super_RefCount._vptr_RefCount = (_func_int **)&PTR__Points_02189890;
  *(undefined8 *)&(this->super_Geometry).field_0x58 = 0;
  *(undefined8 *)&this->field_0x60 = 0;
  *(undefined8 *)&this->field_0x68 = 0;
  *(undefined8 *)&this->field_0x70 = 0;
  *(undefined8 *)&this->field_0x78 = 0x100000000;
  this->field_0x80 = 1;
  *(undefined8 *)&this->field_0x84 = 0;
  *(undefined8 *)&this->field_0x8c = 0;
  *(undefined8 *)((long)&(this->normals0).super_RawBufferView.ptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->normals0).super_RawBufferView.dptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->normals0).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->normals0).super_RawBufferView.num + 4) = 0;
  (this->normals0).super_RawBufferView.modCounter = 1;
  (this->normals0).super_RawBufferView.modified = true;
  (this->normals0).super_RawBufferView.userData = 0;
  (this->normals0).super_RawBufferView.buffer.ptr = (Buffer *)0x0;
  pDVar5 = (this->super_Geometry).device;
  (this->vertices).alloc.device = pDVar5;
  (this->vertices).size_active = 0;
  (this->vertices).size_alloced = 0;
  (this->vertices).items = (BufferView<embree::Vec3fx> *)0x0;
  (this->normals).alloc.device = pDVar5;
  psVar1 = &(this->normals).size_active;
  (this->normals).items = (BufferView<embree::Vec3fa> *)0x0;
  (this->normals).size_active = 0;
  (this->normals).size_alloced = 0;
  (this->vertexAttribs).alloc.device = pDVar5;
  (this->vertexAttribs).size_active = 0;
  (this->vertexAttribs).size_alloced = 0;
  (this->vertexAttribs).items = (BufferView<char> *)0x0;
  this->maxRadiusScale = 1.0;
  uVar26 = (ulong)(this->super_Geometry).numTimeSteps;
  if (uVar26 == 0) {
    (this->vertices).size_active = 0;
  }
  else {
    iVar20 = (*(pDVar5->super_State).super_RefCount._vptr_RefCount[8])(pDVar5,uVar26 * 0x38,8);
    (this->vertices).items = (BufferView<embree::Vec3fx> *)CONCAT44(extraout_var,iVar20);
    if ((this->vertices).size_active == 0) {
      uVar27 = 0;
    }
    else {
      puVar21 = (undefined8 *)&DAT_00000030;
      uVar23 = 0;
      do {
        pBVar6 = (this->vertices).items;
        uVar10 = *(undefined4 *)(puVar21 + -6);
        uVar11 = *(undefined4 *)((long)puVar21 + -0x2c);
        uVar12 = *(undefined4 *)(puVar21 + -5);
        uVar13 = *(undefined4 *)((long)puVar21 + -0x24);
        uVar14 = puVar21[-4];
        uVar15 = puVar21[-3];
        pBVar16 = (Buffer *)puVar21[-1];
        pbVar2 = &pBVar6[-1].super_RawBufferView.modified + (long)puVar21;
        *(undefined8 *)pbVar2 = puVar21[-2];
        ((Ref<embree::Buffer> *)(pbVar2 + 8))->ptr = pBVar16;
        puVar3 = (undefined8 *)((long)&pBVar6[-1].super_RawBufferView.num + (long)puVar21);
        *puVar3 = uVar14;
        puVar3[1] = uVar15;
        puVar4 = (undefined4 *)((long)&pBVar6[-1].super_RawBufferView.dptr_ofs + (long)puVar21);
        *puVar4 = uVar10;
        puVar4[1] = uVar11;
        puVar4[2] = uVar12;
        puVar4[3] = uVar13;
        *(undefined8 *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + (long)puVar21) = *puVar21;
        *puVar21 = 0;
        uVar23 = uVar23 + 1;
        uVar27 = (this->vertices).size_active;
        puVar21 = puVar21 + 7;
      } while (uVar23 < uVar27);
    }
    lVar22 = uVar26 - uVar27;
    if (uVar27 <= uVar26 && lVar22 != 0) {
      lVar24 = uVar27 * 0x38 + 0x30;
      do {
        pBVar6 = (this->vertices).items;
        puVar21 = (undefined8 *)((long)pBVar6 + lVar24 + -0x20);
        *puVar21 = 0;
        puVar21[1] = 0;
        puVar21 = (undefined8 *)((long)pBVar6 + lVar24 + -0x30);
        *puVar21 = 0;
        puVar21[1] = 0;
        *(undefined8 *)((long)pBVar6 + lVar24 + -0x10) = 0x100000000;
        *(undefined1 *)((long)pBVar6 + lVar24 + -8) = 1;
        *(undefined4 *)((long)pBVar6 + lVar24 + -4) = 0;
        *(undefined8 *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar24) = 0;
        lVar24 = lVar24 + 0x38;
        lVar22 = lVar22 + -1;
      } while (lVar22 != 0);
    }
    pDVar5 = (this->vertices).alloc.device;
    if (pDVar5 != (Device *)0x0) {
      (*(pDVar5->super_State).super_RefCount._vptr_RefCount[9])(pDVar5,0);
    }
    (this->vertices).size_active = uVar26;
    (this->vertices).size_alloced = uVar26;
  }
  if (*(char *)&(this->super_Geometry).field_8 == '\x1b') {
    uVar23 = (ulong)(this->super_Geometry).numTimeSteps;
    uVar26 = (this->normals).size_alloced;
    uVar27 = uVar26;
    if ((uVar26 < uVar23) && (uVar27 = uVar23, uVar25 = uVar26, uVar26 != 0)) {
      do {
        uVar27 = uVar25 * 2 + (ulong)(uVar25 * 2 == 0);
        uVar25 = uVar27;
      } while (uVar27 < uVar23);
    }
    uVar25 = *psVar1;
    if (uVar23 < uVar25) {
      lVar22 = uVar23 * 0x38 + 0x30;
      uVar26 = uVar23;
      do {
        plVar7 = *(long **)((long)&(((this->normals).items)->super_RawBufferView).ptr_ofs + lVar22);
        if (plVar7 != (long *)0x0) {
          (**(code **)(*plVar7 + 0x18))();
          uVar25 = *psVar1;
        }
        uVar26 = uVar26 + 1;
        lVar22 = lVar22 + 0x38;
      } while (uVar26 < uVar25);
      uVar26 = (this->normals).size_alloced;
      (this->normals).size_active = uVar23;
      uVar25 = uVar23;
    }
    if (uVar26 == uVar27) {
      lVar22 = uVar23 - uVar25;
      if (uVar25 <= uVar23 && lVar22 != 0) {
        lVar24 = uVar25 * 0x38 + 0x30;
        do {
          pBVar8 = (this->normals).items;
          puVar21 = (undefined8 *)((long)pBVar8 + lVar24 + -0x20);
          *puVar21 = 0;
          puVar21[1] = 0;
          puVar21 = (undefined8 *)((long)pBVar8 + lVar24 + -0x30);
          *puVar21 = 0;
          puVar21[1] = 0;
          *(undefined8 *)((long)pBVar8 + lVar24 + -0x10) = 0x100000000;
          *(undefined1 *)((long)pBVar8 + lVar24 + -8) = 1;
          *(undefined4 *)((long)pBVar8 + lVar24 + -4) = 0;
          *(undefined8 *)((long)&(pBVar8->super_RawBufferView).ptr_ofs + lVar24) = 0;
          lVar24 = lVar24 + 0x38;
          lVar22 = lVar22 + -1;
        } while (lVar22 != 0);
      }
      *psVar1 = uVar23;
    }
    else {
      pDVar5 = (this->normals).alloc.device;
      pBVar8 = (this->normals).items;
      iVar20 = (*(pDVar5->super_State).super_RefCount._vptr_RefCount[8])(pDVar5,uVar27 * 0x38,8);
      (this->normals).items = (BufferView<embree::Vec3fa> *)CONCAT44(extraout_var_00,iVar20);
      if ((this->normals).size_active == 0) {
        uVar26 = 0;
      }
      else {
        lVar22 = 0x30;
        uVar25 = 0;
        do {
          pBVar9 = (this->normals).items;
          puVar21 = (undefined8 *)((long)pBVar8 + lVar22 + -0x30);
          uVar14 = *puVar21;
          uVar15 = puVar21[1];
          puVar21 = (undefined8 *)((long)pBVar8 + lVar22 + -0x20);
          uVar17 = *puVar21;
          uVar18 = puVar21[1];
          puVar21 = (undefined8 *)((long)pBVar8 + lVar22 + -0x10);
          uVar19 = puVar21[1];
          puVar3 = (undefined8 *)((long)pBVar9 + lVar22 + -0x10);
          *puVar3 = *puVar21;
          puVar3[1] = uVar19;
          puVar21 = (undefined8 *)((long)pBVar9 + lVar22 + -0x20);
          *puVar21 = uVar17;
          puVar21[1] = uVar18;
          puVar21 = (undefined8 *)((long)pBVar9 + lVar22 + -0x30);
          *puVar21 = uVar14;
          puVar21[1] = uVar15;
          *(undefined8 *)((long)&(pBVar9->super_RawBufferView).ptr_ofs + lVar22) =
               *(undefined8 *)((long)&(pBVar8->super_RawBufferView).ptr_ofs + lVar22);
          *(undefined8 *)((long)&(pBVar8->super_RawBufferView).ptr_ofs + lVar22) = 0;
          uVar25 = uVar25 + 1;
          uVar26 = (this->normals).size_active;
          lVar22 = lVar22 + 0x38;
        } while (uVar25 < uVar26);
      }
      lVar22 = uVar23 - uVar26;
      if (uVar26 <= uVar23 && lVar22 != 0) {
        lVar24 = uVar26 * 0x38 + 0x30;
        do {
          pBVar9 = (this->normals).items;
          puVar21 = (undefined8 *)((long)pBVar9 + lVar24 + -0x20);
          *puVar21 = 0;
          puVar21[1] = 0;
          puVar21 = (undefined8 *)((long)pBVar9 + lVar24 + -0x30);
          *puVar21 = 0;
          puVar21[1] = 0;
          *(undefined8 *)((long)pBVar9 + lVar24 + -0x10) = 0x100000000;
          *(undefined1 *)((long)pBVar9 + lVar24 + -8) = 1;
          *(undefined4 *)((long)pBVar9 + lVar24 + -4) = 0;
          *(undefined8 *)((long)&(pBVar9->super_RawBufferView).ptr_ofs + lVar24) = 0;
          lVar24 = lVar24 + 0x38;
          lVar22 = lVar22 + -1;
        } while (lVar22 != 0);
      }
      pDVar5 = (this->normals).alloc.device;
      if (pDVar5 != (Device *)0x0) {
        (*(pDVar5->super_State).super_RefCount._vptr_RefCount[9])(pDVar5,pBVar8);
      }
      (this->normals).size_active = uVar23;
      (this->normals).size_alloced = uVar27;
    }
  }
  return;
}

Assistant:

Points::Points(Device* device, Geometry::GType gtype) : Geometry(device, gtype, 0, 1)
  {
    vertices.resize(numTimeSteps);
    if (getType() == GTY_ORIENTED_DISC_POINT)
      normals.resize(numTimeSteps);
  }